

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aarect.h
# Opt level: O3

bool __thiscall yz_rect::hit(yz_rect *this,ray *r,double t0,double t1,hit_record *rec)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar8;
  
  dVar8 = (this->k - (r->orig).e[0]) / (r->dir).e[0];
  bVar2 = false;
  if ((t0 <= dVar8) && (dVar8 <= t1)) {
    dVar3 = (r->dir).e[1] * dVar8 + (r->orig).e[1];
    dVar7 = (r->dir).e[2] * dVar8 + (r->orig).e[2];
    dVar4 = this->y0;
    if ((dVar3 < dVar4) ||
       (((this->y1 < dVar3 || (dVar1 = this->z0, dVar7 < dVar1)) || (this->z1 < dVar7)))) {
      bVar2 = false;
    }
    else {
      auVar5._0_8_ = dVar3 - dVar4;
      auVar5._8_8_ = dVar7 - dVar1;
      auVar6._8_8_ = this->z1 - dVar1;
      auVar6._0_8_ = this->y1 - dVar4;
      auVar6 = divpd(auVar5,auVar6);
      rec->u = (double)auVar6._0_8_;
      rec->v = (double)auVar6._8_8_;
      rec->t = dVar8;
      dVar4 = 0.0;
      dVar3 = (r->dir).e[2] * 0.0 + (r->dir).e[1] * 0.0 + (r->dir).e[0];
      rec->front_face = dVar3 < 0.0;
      if (0.0 <= dVar3) {
        dVar4 = -0.0;
      }
      (rec->normal).e[0] = *(double *)(&DAT_00124070 + (ulong)(dVar3 < 0.0) * 8);
      (rec->normal).e[1] = dVar4;
      (rec->normal).e[2] = dVar4;
      (rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      dVar4 = (r->dir).e[2];
      dVar3 = (r->orig).e[2];
      dVar7 = (r->orig).e[1];
      dVar1 = (r->dir).e[1];
      (rec->p).e[0] = dVar8 * (r->dir).e[0] + (r->orig).e[0];
      (rec->p).e[1] = dVar8 * dVar1 + dVar7;
      (rec->p).e[2] = dVar8 * dVar4 + dVar3;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool yz_rect::hit(const ray& r, double t0, double t1, hit_record& rec) const {
    auto t = (k-r.origin().x()) / r.direction().x();
    if (t < t0 || t > t1)
        return false;
    auto y = r.origin().y() + t*r.direction().y();
    auto z = r.origin().z() + t*r.direction().z();
    if (y < y0 || y > y1 || z < z0 || z > z1)
        return false;
    rec.u = (y-y0)/(y1-y0);
    rec.v = (z-z0)/(z1-z0);
    rec.t = t;
    vec3 outward_normal = vec3(1, 0, 0);
    rec.set_face_normal(r, outward_normal);
    rec.mat_ptr = mp;
    rec.p = r.at(t);
    return true;
}